

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_tables.c
# Opt level: O3

size_t mm_table_load(mm_context_t *context,uint8_t table_id,uint64_t version_timestamp,
                    uint8_t *buffer,size_t buflen)

{
  int iVar1;
  undefined7 in_register_00000031;
  char sql [512];
  char acStack_238 [520];
  
  memset(acStack_238,0,0x200);
  snprintf(acStack_238,0x200,
           "SELECT TABLE_DATA from TERMDAT where (TABLE_ID = %d and VERSION_TIMESTAMP = %lu);",
           CONCAT71(in_register_00000031,table_id) & 0xffffffff,version_timestamp);
  iVar1 = mm_sql_read_blob(context->database,acStack_238,buffer,buflen);
  return (long)iVar1;
}

Assistant:

size_t mm_table_load(mm_context_t *context, uint8_t table_id, uint64_t version_timestamp, uint8_t *buffer, size_t buflen) {
    char sql[512] = { 0 };
    size_t blob_len;

    snprintf(sql, sizeof(sql), "SELECT TABLE_DATA from TERMDAT where (TABLE_ID = %d and VERSION_TIMESTAMP = %" PRIu64 ");",
        table_id, version_timestamp);

    blob_len = mm_sql_read_blob(context->database, sql, buffer, buflen);

    return blob_len;
}